

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::RecyclableData::RecyclableData(RecyclableData *this,Recycler *recycler)

{
  Type *local_68;
  RecyclableData *local_48;
  nullptr_t local_40;
  nullptr_t local_38 [3];
  nullptr_t local_20;
  Recycler *local_18;
  Recycler *recycler_local;
  RecyclableData *this_local;
  
  local_48 = this;
  local_18 = recycler;
  recycler_local = (Recycler *)this;
  do {
    Memory::WriteBarrierPtr<Js::TempArenaAllocatorWrapper<false>_>::WriteBarrierPtr
              (local_48->temporaryArenaAllocators);
    local_48 = (RecyclableData *)(local_48->temporaryArenaAllocators + 1);
  } while (local_48 != (RecyclableData *)this->temporaryGuestArenaAllocators);
  local_68 = this->temporaryGuestArenaAllocators;
  do {
    Memory::WriteBarrierPtr<Js::TempArenaAllocatorWrapper<true>_>::WriteBarrierPtr(local_68);
    local_68 = local_68 + 1;
  } while (local_68 != (Type *)&this->pendingFinallyException);
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::WriteBarrierPtr
            (&this->pendingFinallyException,&local_20);
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::WriteBarrierPtr(&this->exceptionObject);
  Js::JavascriptExceptionObject::JavascriptExceptionObject
            (&this->soErrorObject,(Var)0x0,(ScriptContext *)0x0,(JavascriptExceptionContext *)0x0,
             true);
  Js::JavascriptExceptionObject::JavascriptExceptionObject
            (&this->oomErrorObject,(Var)0x0,(ScriptContext *)0x0,(JavascriptExceptionContext *)0x0,
             true);
  Js::JavascriptExceptionObject::JavascriptExceptionObject
            (&this->terminatedErrorObject,(Var)0x0,(ScriptContext *)0x0,
             (JavascriptExceptionContext *)0x0,false);
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::WriteBarrierPtr
            (&this->unhandledExceptionObject);
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::WriteBarrierPtr
            (&this->tempUncaughtException);
  JsUtil::
  BaseDictionary<int,_JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->typesWithProtoPropertyCache,local_18,0);
  JsUtil::
  WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
  ::WeaklyReferencedKeyDictionary(&this->propertyGuards,local_18,0x80,(EntryRemovalCallback *)0x0);
  Memory::
  WriteBarrierPtr<JsUtil::BaseHashSet<Js::CaseInvariantPropertyListWithHashCode_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::CaseInvariantPropertyListWithHashCode_*,_JsUtil::NoCaseComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->caseInvariantPropertySet);
  Memory::
  WriteBarrierPtr<JsUtil::List<const_Js::PropertyRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierPtr(&this->boundPropertyStrings);
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->sourceProfileManagersByUrl);
  JsUtil::DoublyLinkedList<Js::CodeGenRecyclableData,_Memory::Recycler>::DoublyLinkedList
            (&this->codeGenRecyclableDatas);
  local_38[0] = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::WriteBarrierPtr
            (&this->oldEntryPointInfo,local_38);
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->symbolRegistrationMap);
  local_40 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierPtr(&this->returnedValueList,&local_40);
  this->constructorCacheInvalidationCount = 0;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierPtr(&this->autoProxyName);
  return;
}

Assistant:

ThreadContext::RecyclableData::RecyclableData(Recycler *const recycler) :
    pendingFinallyException(nullptr),
    soErrorObject(nullptr, nullptr, nullptr, true),
    oomErrorObject(nullptr, nullptr, nullptr, true),
    terminatedErrorObject(nullptr, nullptr, nullptr),
    typesWithProtoPropertyCache(recycler),
#if ENABLE_NATIVE_CODEGEN
    propertyGuards(recycler, 128),
#endif
    oldEntryPointInfo(nullptr),
#ifdef ENABLE_SCRIPT_DEBUGGING
    returnedValueList(nullptr),
#endif
    constructorCacheInvalidationCount(0)
{
}